

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void move_item_forward(c2m_ctx_t c2m_ctx,MIR_item_t item)

{
  gen_ctx_conflict *pgVar1;
  MIR_module_t pMVar2;
  MIR_item_t pMVar3;
  MIR_item_t pMVar4;
  char *name;
  MIR_item_t pMVar5;
  int *piVar6;
  DLIST_MIR_item_t *list;
  
  pgVar1 = c2m_ctx->gen_ctx;
  pMVar5 = pgVar1->curr_func;
  if (pMVar5 == (MIR_item_t)0x0) {
    __assert_fail("curr_func != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2d6f,"void move_item_forward(c2m_ctx_t, MIR_item_t)");
  }
  pMVar2 = pMVar5->module;
  if ((pMVar2->items).tail != item) {
    return;
  }
  list = &pMVar2->items;
  pMVar5 = item;
  DLIST_MIR_item_t_remove(list,item);
  if (((item == (MIR_item_t)0x0) || (pMVar3 = pgVar1->curr_func, pMVar3 == (MIR_item_t)0x0)) ||
     (pMVar2 = pMVar3->module, (pMVar2->items).tail == (MIR_item_t_conflict)0x0)) {
    move_item_forward_cold_3();
LAB_001ab9f1:
    move_item_forward_cold_1();
  }
  else {
    pMVar4 = (pMVar3->item_link).prev;
    pMVar5 = (pMVar2->items).head;
    if (pMVar4 != (MIR_item_t)0x0) {
      if (pMVar5 != (MIR_item_t)0x0) {
        (pMVar4->item_link).next = item;
        (item->item_link).prev = pMVar4;
        (pMVar3->item_link).prev = item;
        (item->item_link).next = pMVar3;
        return;
      }
      goto LAB_001ab9f1;
    }
    if (pMVar5 == pMVar3) {
      (pMVar3->item_link).prev = item;
      (item->item_link).next = pMVar3;
      (item->item_link).prev = (MIR_item_t)0x0;
      (pMVar2->items).head = item;
      return;
    }
  }
  move_item_forward_cold_2();
  pMVar2 = pMVar5->module;
  if (*(int *)&pMVar5->data == 0x7d) {
LAB_001aba46:
    if (*(int *)&pMVar2[1].data != 0x58) {
      MIR_new_forward((MIR_context_t)list->head,name);
      return;
    }
    MIR_new_export((MIR_context_t)list->head,name);
    return;
  }
  if (*(int *)&pMVar5->data == 0x55) {
    piVar6 = *(int **)&pMVar5->item_type;
    if (piVar6 != (int *)0x0) {
      piVar6 = *(int **)(piVar6 + 6);
    }
    if (((*piVar6 == 0x5d) && ((pMVar2->items).tail == list[0x18].head)) &&
       ((*(int *)(pMVar2[1].name + 0x18) != 7 && (((ulong)(pMVar2->module_link).next & 3) == 0))))
    goto LAB_001aba46;
  }
  return;
}

Assistant:

static void move_item_forward (c2m_ctx_t c2m_ctx, MIR_item_t item) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;

  assert (curr_func != NULL);
  if (DLIST_TAIL (MIR_item_t, curr_func->module->items) != item) return;
  DLIST_REMOVE (MIR_item_t, curr_func->module->items, item);
  DLIST_INSERT_BEFORE (MIR_item_t, curr_func->module->items, curr_func, item);
}